

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcSetFunction(char *name,NULLCFuncPtr func)

{
  nullres nVar1;
  uint sourceId;
  uint targetId;
  
  targetId = func.id;
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    sourceId = nullcFindFunctionIndex(name);
    if (sourceId != 0xffffffff) {
      if (*(uint *)(NULLC::linker + 0x24c) <= targetId) {
LAB_0010ec5f:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      if (*(char *)(*(long *)(NULLC::linker + 0x240) + 0x35 + (ulong)targetId * 0x94) == '\0') {
        if (*(uint *)(NULLC::linker + 0x24c) <= sourceId) goto LAB_0010ec5f;
        if (*(int *)(*(long *)(NULLC::linker + 0x240) + 0x10 + (ulong)sourceId * 0x94) == 0) {
          nVar1 = nullcRedirectFunction(sourceId,targetId);
          return nVar1;
        }
        NULLC::nullcLastError = "ERROR: can\'t override builtin function";
      }
      else {
        NULLC::nullcLastError = "ERROR: source function uses context, which is unavailable";
      }
    }
  }
  return '\0';
}

Assistant:

nullres nullcSetFunction(const char* name, NULLCFuncPtr func)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	unsigned index = nullcFindFunctionIndex(name);
	if(index == ~0u)
		return false;

	if(linker->exFunctions[func.id].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: source function uses context, which is unavailable";
		return false;
	}

	if(linker->exFunctions[index].builtinIndex != 0)
	{
		nullcLastError = "ERROR: can't override builtin function";
		return false;
	}

	return nullcRedirectFunction(index, func.id);
}